

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void store_be64(uint8_t *p,uint64_t x)

{
  uint64_t x_local;
  uint8_t *p_local;
  
  *p = (uint8_t)(x >> 0x38);
  p[1] = (uint8_t)(x >> 0x30);
  p[2] = (uint8_t)(x >> 0x28);
  p[3] = (uint8_t)(x >> 0x20);
  p[4] = (uint8_t)(x >> 0x18);
  p[5] = (uint8_t)(x >> 0x10);
  p[6] = (uint8_t)(x >> 8);
  p[7] = (uint8_t)x;
  return;
}

Assistant:

static void
store_be64(uint8_t *p, uint64_t x)
{
	p[0] = (x >> 56) & 0xff;
	p[1] = (x >> 48) & 0xff;
	p[2] = (x >> 40) & 0xff;
	p[3] = (x >> 32) & 0xff;
	p[4] = (x >> 24) & 0xff;
	p[5] = (x >> 16) & 0xff;
	p[6] = (x >>  8) & 0xff;
	p[7] = (x >>  0) & 0xff;
}